

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O0

Buffer * __thiscall Pl_Buffer::getBuffer(Pl_Buffer *this)

{
  pointer pMVar1;
  logic_error *this_00;
  Buffer *this_01;
  Buffer *b;
  Pl_Buffer *this_local;
  
  pMVar1 = std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
                     (&this->m);
  if ((pMVar1->ready & 1U) == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Pl_Buffer::getBuffer() called when not ready");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = (Buffer *)operator_new(8);
  pMVar1 = std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
                     (&this->m);
  Buffer::Buffer(this_01,&pMVar1->data);
  std::unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>::operator->
            (&this->m);
  std::__cxx11::string::clear();
  return this_01;
}

Assistant:

Buffer*
Pl_Buffer::getBuffer()
{
    if (!m->ready) {
        throw std::logic_error("Pl_Buffer::getBuffer() called when not ready");
    }
    auto* b = new Buffer(std::move(m->data));
    m->data.clear();
    return b;
}